

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::FormatMatcherDescription
                   (string *__return_storage_ptr__,char *matcher_name,char *description,
                   Interpolations *interp,Strings *param_values)

{
  ulong uVar1;
  size_t __first;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  char *id_name;
  string local_e0;
  int local_bc;
  ulong uStack_b8;
  int param_index;
  size_t i;
  char *last_interp_end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_58;
  undefined1 local_31;
  Strings *local_30;
  Strings *param_values_local;
  Interpolations *interp_local;
  char *description_local;
  char *matcher_name_local;
  string *result;
  
  local_31 = 0;
  local_30 = param_values;
  param_values_local = (Strings *)interp;
  interp_local = (Interpolations *)description;
  description_local = matcher_name;
  matcher_name_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (*(char *)&(interp_local->
                super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                )._M_impl.super__Vector_impl_data._M_start == '\0') {
    ConvertIdentifierNameToWords_abi_cxx11_(&local_58,(internal *)description_local,id_name);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_30);
    if (sVar2 != 0) {
      JoinAsTuple((string *)&last_interp_end,local_30);
      std::operator+(&local_88," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &last_interp_end);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&last_interp_end);
    }
  }
  else {
    i = (size_t)interp_local;
    for (uStack_b8 = 0; uVar1 = uStack_b8,
        sVar2 = std::
                vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                ::size((vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                        *)param_values_local), __first = i, uVar1 < sVar2; uStack_b8 = uStack_b8 + 1
        ) {
      pvVar3 = std::
               vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
               ::operator[]((vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                             *)param_values_local,uStack_b8);
      std::__cxx11::string::append<char_const*,void>
                ((string *)__return_storage_ptr__,(char *)__first,pvVar3->start_pos);
      pvVar3 = std::
               vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
               ::operator[]((vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                             *)param_values_local,uStack_b8);
      local_bc = pvVar3->param_index;
      if (local_bc == -1) {
        JoinAsTuple(&local_e0,local_30);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      else if (local_bc == -2) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'%');
      }
      else if (local_bc != -3) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_30,(long)local_bc);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar4);
      }
      pvVar3 = std::
               vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
               ::operator[]((vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                             *)param_values_local,uStack_b8);
      i = (size_t)pvVar3->end_pos;
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)i);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatMatcherDescription(
    const char* matcher_name, const char* description,
    const Interpolations& interp, const Strings& param_values) {
  string result;
  if (*description == '\0') {
    // When the user supplies an empty description, we calculate one
    // from the matcher name.
    result = ConvertIdentifierNameToWords(matcher_name);
    if (param_values.size() >= 1)
      result += " " + JoinAsTuple(param_values);
  } else {
    // The end position of the last interpolation.
    const char* last_interp_end = description;
    for (size_t i = 0; i < interp.size(); i++) {
      result.append(last_interp_end, interp[i].start_pos);
      const int param_index = interp[i].param_index;
      if (param_index == kTupleInterpolation) {
        result += JoinAsTuple(param_values);
      } else if (param_index == kPercentInterpolation) {
        result += '%';
      } else if (param_index != kInvalidInterpolation) {
        result += param_values[param_index];
      }
      last_interp_end = interp[i].end_pos;
    }
    result += last_interp_end;
  }

  return result;
}